

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O1

void __thiscall IPAsirMiniSAT::ana(IPAsirMiniSAT *this)

{
  int iVar1;
  int iVar2;
  uchar *__s;
  long lVar3;
  
  iVar1 = (this->super_SimpSolver).super_Solver.vardata.sz;
  this->szfmap = iVar1;
  iVar2 = -1;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  __s = (uchar *)operator_new__((long)iVar2);
  this->fmap = __s;
  memset(__s,0,(long)iVar1);
  if (0 < (this->super_SimpSolver).super_Solver.conflict.sz) {
    lVar3 = 0;
    do {
      this->fmap[(this->super_SimpSolver).super_Solver.conflict.data[lVar3].x >> 1] = '\x01';
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_SimpSolver).super_Solver.conflict.sz);
  }
  return;
}

Assistant:

void ana()
    {
        fmap = new unsigned char[szfmap = nVars()];
        memset(fmap, 0, szfmap);
        for (int i = 0; i < conflict.size(); i++) {
            int tmp = var(conflict[i]);
            assert(0 <= tmp && tmp < szfmap);
            fmap[tmp] = 1;
        }
    }